

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall
sfc::Map::add(Map *this,Image *image,Tileset *tileset,Palette *palette,uint bpp,uint pos_x,
             uint pos_y)

{
  pointer pMVar1;
  pointer ppSVar2;
  pointer pMVar3;
  TileFlipped TVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  runtime_error *this_00;
  pointer ppSVar8;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> spv;
  Tile remapped_tile;
  Image remapped_image;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> local_188;
  Palette *local_170;
  Tile local_168;
  Tile local_110;
  Image local_b8;
  
  if ((ulong)(((long)(this->_entries).
                     super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->_entries).
                     super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
      (ulong)(this->_map_width * pos_y + pos_x)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Map entry out of bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_168._mode = snes;
  local_168._bpp = 4;
  local_168._width = 8;
  local_168._height = 8;
  local_168._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Palette::subpalettes_matching(&local_188,palette,image);
  if (local_188.
      super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_188.
      super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = 0xffffffff;
    uVar5 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    ppSVar2 = local_188.
              super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_170 = palette;
    do {
      ppSVar8 = ppSVar2 + 1;
      Image::Image(&local_b8,image,*ppSVar2);
      Tile::Tile(&local_110,&local_b8,this->_mode,bpp,true);
      uVar5 = Tileset::index_of(tileset,&local_110);
      if (uVar5 != 0xffffffff) {
        uVar6 = Palette::index_of(local_170,*ppSVar2);
        local_168._mode = local_110._mode;
        local_168._bpp = local_110._bpp;
        local_168._width = local_110._width;
        local_168._height = local_110._height;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_168._data,&local_110._data);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(&local_168._mirrors,&local_110._mirrors);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&local_168._palette,&local_110._palette);
      }
      if (local_110._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110._palette.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._palette.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._palette.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_110._mirrors);
      if (local_110._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110._data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_b8._colors._M_t);
      if (local_b8._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._palette.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8._palette.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._palette.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8._indexed_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._indexed_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8._indexed_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._indexed_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8._data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8._data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8._data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while ((uVar5 == 0xffffffff) &&
            (ppSVar2 = ppSVar8,
            ppSVar8 !=
            local_188.
            super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>.
            _M_impl.super__Vector_impl_data._M_finish));
  }
  if (local_188.
      super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar5 == 0xffffffff) {
    local_b8._0_8_ = ZEXT48(image->_src_coord_x);
    local_b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(ulong)image->_src_coord_y;
    fmt.size_ = 0x26;
    fmt.data_ = "  No matching tile for position {},{}\n";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_b8;
    args.desc_ = 0x22;
    ::fmt::v10::vprint(_stderr,fmt,args);
  }
  else {
    uVar7 = max_tile_count_for_mode(this->_mode);
    if ((int)uVar5 < (int)uVar7) {
      TVar4 = Tile::is_flipped((tileset->_tiles).
                               super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                               super__Vector_impl_data._M_start + (int)uVar5,&local_168);
      uVar7 = pos_y * this->_map_width + pos_x;
      pMVar1 = (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar1[uVar7].tile_index = uVar5;
      pMVar1[uVar7].palette_index = uVar6;
      pMVar1[uVar7].flip_h = (bool)(TVar4.h & 1);
      pMVar1[uVar7].flip_v = (bool)(TVar4.v & 1);
      goto LAB_00139f90;
    }
    local_b8._0_8_ = ZEXT48(image->_src_coord_x);
    local_b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(ulong)image->_src_coord_y;
    fmt_00.size_ = 0x3a;
    fmt_00.data_ = "  Mapped tile exceeds allowed map index at position {},{}\n";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_b8;
    args_00.desc_ = 0x22;
    ::fmt::v10::vprint(_stderr,fmt_00,args_00);
  }
  uVar5 = pos_y * this->_map_width + pos_x;
  pMVar1 = (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = pMVar1 + uVar5;
  pMVar3->flip_h = false;
  pMVar3->flip_v = false;
  pMVar1 = pMVar1 + uVar5;
  pMVar1->tile_index = 0;
  pMVar1->palette_index = 0;
LAB_00139f90:
  if (local_168._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168._palette.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168._palette.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168._palette.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_168._mirrors);
  if (local_168._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Map::add(const sfc::Image& image, const sfc::Tileset& tileset, const sfc::Palette& palette, unsigned bpp, unsigned pos_x, unsigned pos_y) {
  if (((pos_y * _map_width) + pos_x) > _entries.size())
    throw std::runtime_error("Map entry out of bounds");

  int tileset_index = -1;
  int palette_index = -1;
  Tile matched_tile;
  {
    // search all viable palette mappings of image in tileset
    const auto spv = palette.subpalettes_matching(image);
    for (const auto& p : spv) {
      const Image remapped_image = Image(image, *p);
      Tile remapped_tile(remapped_image, _mode, bpp, true);
      tileset_index = tileset.index_of(remapped_tile);
      if (tileset_index != -1) {
        palette_index = palette.index_of(*p);
        matched_tile = remapped_tile;
        break;
      }
    }
  }

  if (tileset_index == -1) {
    fmt::print(stderr, "  No matching tile for position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else if (tileset_index >= (int)max_tile_count_for_mode(_mode)) {
    fmt::print(stderr, "  Mapped tile exceeds allowed map index at position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else {
    const TileFlipped flipped = tileset.tiles()[tileset_index].is_flipped(matched_tile);
    _entries[(pos_y * _map_width) + pos_x] =
      Mapentry(tileset_index, palette_index, flipped.h, flipped.v);
  }
}